

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * __thiscall
OpenMD::OpenMD_itoa_abi_cxx11_(string *__return_storage_ptr__,OpenMD *this,int value,uint base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  ulong uVar3;
  int iVar4;
  string buf;
  string sign;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  buf._M_dataplus._M_p = (pointer)paVar1;
  if (value - 0x11U < 0xfffffff0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) =
         CONCAT17(buf.field_2._M_local_buf[8],buf.field_2._M_allocated_capacity._1_7_);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = buf.field_2._9_4_;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = buf.field_2._13_2_;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = buf.field_2._M_local_buf[0xf];
    __return_storage_ptr__->_M_string_length = 0;
  }
  else {
    iVar4 = (int)this;
    uVar3 = (ulong)this & 0xffffffff;
    if (iVar4 != 0) {
      sign._M_dataplus._M_p = (pointer)&sign.field_2;
      sign._M_string_length = 0;
      sign.field_2._M_local_buf[0] = '\0';
      if (iVar4 < 0) {
        std::__cxx11::string::assign((char *)&sign);
        uVar3 = (ulong)(uint)-iVar4;
      }
      for (iVar4 = -0x1e; ((int)uVar3 != 0 && (iVar4 != 0)); iVar4 = iVar4 + 1) {
        std::operator+(&local_50,"0123456789abcdef"[uVar3 % (ulong)(uint)value],&buf);
        std::__cxx11::string::operator=((string *)&buf,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        uVar3 = uVar3 / (uint)value;
      }
      psVar2 = (string *)std::__cxx11::string::append((string *)&sign);
      std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
      std::__cxx11::string::~string((string *)&sign);
      goto LAB_001ba3f2;
    }
    std::__cxx11::string::assign((char *)&buf);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buf._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buf.field_2._M_allocated_capacity._1_7_,buf.field_2._M_local_buf[0]);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(buf.field_2._M_local_buf[0xf],
                    CONCAT25(buf.field_2._13_2_,
                             CONCAT41(buf.field_2._9_4_,buf.field_2._M_local_buf[8])));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = buf._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(buf.field_2._M_allocated_capacity._1_7_,buf.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = buf._M_string_length;
  }
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  buf._M_dataplus._M_p = (pointer)paVar1;
LAB_001ba3f2:
  std::__cxx11::string::~string((string *)&buf);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMD_itoa(int value, unsigned int base) {
    const char digitMap[] = "0123456789abcdef";
    std::string buf;

    if (base == 0 || base > 16) { return buf; }

    if (value == 0) {
      buf = "0";
      return buf;
    }

    // Take care negative int:

    std::string sign;
    int _value = value;
    if (value < 0) {
      _value = -value;
      sign   = "-";
    }

    // Translating number to string with base:
    for (int i = 30; _value && i; --i) {
      buf = digitMap[_value % base] + buf;
      _value /= base;
    }
    return sign.append(buf);
  }